

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_torrent.cpp
# Opt level: O0

void libtorrent::set_piece_hashes
               (create_torrent *t,string *p,settings_pack *sett,
               function<void_(libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>)>
               *f,error_code *ec)

{
  disk_io_constructor_type local_50;
  error_code *local_30;
  error_code *ec_local;
  function<void_(libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>)>
  *f_local;
  settings_pack *sett_local;
  string *p_local;
  create_torrent *t_local;
  
  local_30 = ec;
  ec_local = (error_code *)f;
  f_local = (function<void_(libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>)>
             *)sett;
  sett_local = (settings_pack *)p;
  p_local = (string *)t;
  ::std::
  function<std::unique_ptr<libtorrent::disk_interface,std::default_delete<libtorrent::disk_interface>>(boost::asio::io_context&,libtorrent::settings_interface_const&,libtorrent::counters&)>
  ::
  function<std::unique_ptr<libtorrent::disk_interface,std::default_delete<libtorrent::disk_interface>>(&)(boost::asio::io_context&,libtorrent::settings_interface_const&,libtorrent::counters&),void>
            ((function<std::unique_ptr<libtorrent::disk_interface,std::default_delete<libtorrent::disk_interface>>(boost::asio::io_context&,libtorrent::settings_interface_const&,libtorrent::counters&)>
              *)&local_50,default_disk_io_constructor);
  set_piece_hashes(t,p,sett,&local_50,
                   (function<void_(libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>)>
                    *)ec_local,local_30);
  ::std::
  function<std::unique_ptr<libtorrent::disk_interface,_std::default_delete<libtorrent::disk_interface>_>_(boost::asio::io_context_&,_const_libtorrent::settings_interface_&,_libtorrent::counters_&)>
  ::~function(&local_50);
  return;
}

Assistant:

void set_piece_hashes(create_torrent& t, std::string const& p
		, settings_pack const& sett
		, std::function<void(piece_index_t)> const& f, error_code& ec)
	{
		set_piece_hashes(t, p, sett, default_disk_io_constructor, f, ec);
	}